

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testMajorAxis<Imath_2_5::Vec2<int>>(char *type)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  int *piVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec2<int>_> b_2;
  Vec2<int> max;
  uint j_1;
  uint i_1;
  uint j;
  Vec2<int> size;
  uint major;
  Box<Imath_2_5::Vec2<int>_> b_1;
  uint i;
  vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_> perms;
  Box<Imath_2_5::Vec2<int>_> b;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff50;
  Vec2<int> local_98 [3];
  Vec2<int> in_stack_ffffffffffffff80;
  uint local_78;
  uint local_74;
  uint local_70;
  Vec2<int> local_6c;
  Vec2<int> local_64;
  uint local_5c;
  Vec2<int> local_58 [3];
  uint local_40;
  vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_> local_30;
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    majorAxis() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  uVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::majorAxis
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (uVar1 != 0) {
    __assert_fail("b.majorAxis() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x394,
                  "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  std::vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_>::vector
            ((vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_> *)0x125333);
  permutations<Imath_2_5::Vec2<int>>
            ((vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_> *)
             in_stack_ffffffffffffff80);
  local_40 = 0;
  while( true ) {
    uVar4 = (ulong)local_40;
    sVar5 = std::vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_>::size
                      (&local_30);
    if (sVar5 <= uVar4) {
      std::vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_>::~vector
                ((vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_> *)
                 in_stack_ffffffffffffff50);
      local_74 = 0;
      do {
        uVar1 = local_74;
        uVar2 = Imath_2_5::Vec2<int>::dimensions();
        if (uVar2 <= uVar1) {
          return;
        }
        local_78 = 0;
        while( true ) {
          uVar2 = Imath_2_5::Vec2<int>::dimensions();
          if (uVar2 <= local_78) break;
          Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffff80,0);
          piVar6 = Imath_2_5::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffff80,local_78);
          *piVar6 = 1;
          Imath_2_5::Vec2<int>::Vec2(local_98,0);
          Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
                    (in_stack_ffffffffffffff50,
                     (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,uVar1));
          uVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::majorAxis
                            ((Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_ffffffffffffff44,uVar1)
                            );
          if (uVar2 != local_78) {
            __assert_fail("b.majorAxis() == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                          ,0x3c2,
                          "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<int>]"
                         );
          }
          local_78 = local_78 + 1;
        }
        local_74 = local_74 + 1;
      } while( true );
    }
    Imath_2_5::Vec2<int>::Vec2(local_58,0);
    std::vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_>::operator[]
              (&local_30,(ulong)local_40);
    Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
              (in_stack_ffffffffffffff50,
               (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_5c = 0;
    in_stack_ffffffffffffff50 =
         (Box<Imath_2_5::Vec2<int>_> *)
         std::vector<Imath_2_5::Vec2<int>,_std::allocator<Imath_2_5::Vec2<int>_>_>::operator[]
                   (&local_30,(ulong)local_40);
    Imath_2_5::Vec2<int>::Vec2(&local_6c,0);
    Imath_2_5::Vec2<int>::operator-
              ((Vec2<int> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_70 = 1;
    while( true ) {
      in_stack_ffffffffffffff4c = local_70;
      uVar1 = Imath_2_5::Vec2<int>::dimensions();
      if (uVar1 <= in_stack_ffffffffffffff4c) break;
      piVar6 = Imath_2_5::Vec2<int>::operator[](&local_64,local_70);
      in_stack_ffffffffffffff48 = *piVar6;
      piVar6 = Imath_2_5::Vec2<int>::operator[](&local_64,local_5c);
      if (*piVar6 < in_stack_ffffffffffffff48) {
        local_5c = local_70;
      }
      local_70 = local_70 + 1;
    }
    in_stack_ffffffffffffff44 =
         Imath_2_5::Box<Imath_2_5::Vec2<int>_>::majorAxis
                   ((Box<Imath_2_5::Vec2<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (in_stack_ffffffffffffff44 != local_5c) break;
    local_40 = local_40 + 1;
  }
  __assert_fail("b.majorAxis() == major",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                ,0x3a9,
                "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<int>]"
               );
}

Assistant:

void
testMajorAxis(const char *type)
{
    cout << "    majorAxis() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.majorAxis() == 0);
    }

    //
    // Non-empty, has-volume box.
    // Boxes are [ (0, 0, ...), (<all permutations of 1..T::dimensions()>) ]
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), perms[i]);

            unsigned int major = 0;
            T size = perms[i] - T(0);
            for (unsigned int j = 1; j < T::dimensions(); j++)
                if (size[j] > size[major])
                    major = j;
                    
            assert(b.majorAxis() == major);
        }
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0), (1, 0) ]
    //    2D: [(0, 0), (0, 1) ]
    //
    //    3D: [(0, 0), (1, 0, 0) ]
    //    3D: [(0, 0), (0, 1, 0) ]
    //    3D: [(0, 0), (0, 0, 1) ]
    //
    //    and similarly for 4D
    //
    {
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            for (unsigned int j = 0; j < T::dimensions(); j++)
            {
                T max(0);
                max[j] = 1;

                IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), max);
                assert(b.majorAxis() == j);
            }
        }
    }
}